

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1558.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  CURLcode ec_1;
  CURLcode ec;
  long protocol;
  CURL *curl;
  char *pcStack_18;
  CURLcode res;
  char *URL_local;
  
  curl._4_4_ = 0;
  protocol = 0;
  _ec_1 = 0;
  pcStack_18 = URL;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1558.c"
                  ,0x22,iVar2,uVar3);
    curl._4_4_ = iVar2;
  }
  if (curl._4_4_ == 0) {
    protocol = curl_easy_init();
    if (protocol == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1558.c"
                    ,0x23);
      curl._4_4_ = 0x7c;
    }
    if (curl._4_4_ == 0) {
      iVar2 = curl_easy_setopt(protocol,0x2712,pcStack_18);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1558.c"
                      ,0x25,iVar2,uVar3);
        curl._4_4_ = iVar2;
      }
      if (curl._4_4_ == 0) {
        iVar2 = curl_easy_perform(protocol);
        uVar1 = _stderr;
        curl._4_4_ = iVar2;
        if (iVar2 == 0) {
          iVar2 = curl_easy_getinfo(protocol,0x200030,&ec_1);
          uVar1 = _stderr;
          curl._4_4_ = iVar2;
          if (iVar2 == 0) {
            curl_mprintf("Protocol: %x\n",_ec_1);
            curl_easy_cleanup(protocol);
            curl_global_cleanup();
            return 0;
          }
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"curl_easy_getinfo() returned %d (%s)\n",iVar2,uVar3);
        }
        else {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"curl_easy_perform() returned %d (%s)\n",iVar2,uVar3);
        }
      }
    }
    curl_easy_cleanup(protocol);
    curl_global_cleanup();
    URL_local._4_4_ = curl._4_4_;
  }
  else {
    URL_local._4_4_ = curl._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLcode res = 0;
  CURL *curl = NULL;
  long protocol = 0;

  global_init(CURL_GLOBAL_ALL);
  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  res = curl_easy_perform(curl);
  if(res) {
    fprintf(stderr, "curl_easy_perform() returned %d (%s)\n",
            res, curl_easy_strerror(res));
    goto test_cleanup;
  }

  res = curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);
  if(res) {
    fprintf(stderr, "curl_easy_getinfo() returned %d (%s)\n",
            res, curl_easy_strerror(res));
    goto test_cleanup;
  }

  printf("Protocol: %x\n", protocol);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return 0;

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res; /* return the final return code */
}